

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Arena *this_00;
  
  this_00 = *(Arena **)this;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(Arena **)(((ulong)this_00 & 0xfffffffffffffffe) + 0x20);
  }
  if (this_00 == (Arena *)0x0) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x28)
    ;
    (pbVar1->field_2)._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pbVar1->field_2 + 8) = 0;
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (this_00,(type_info *)
                         &InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                          ::Container::typeinfo,0x28);
    }
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x28,
                        arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                       );
    (pbVar1->field_2)._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pbVar1->field_2 + 8) = 0;
  }
  pbVar1[1]._M_dataplus._M_p = (pointer)0x0;
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  pbVar1->_M_string_length = 0;
  *(ulong *)this = (ulong)pbVar1 | 1;
  pbVar1[1]._M_dataplus._M_p = (pointer)this_00;
  return pbVar1;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }